

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureTransform.h
# Opt level: O2

bool __thiscall Assimp::STransformVecInfo::IsUntransformed(STransformVecInfo *this)

{
  ai_real *paVar1;
  undefined1 auVar2 [16];
  undefined4 in_EAX;
  int iVar3;
  
  auVar2._4_4_ = -(uint)((this->super_aiUVTransform).mTranslation.y != 0.0);
  auVar2._0_4_ = -(uint)((this->super_aiUVTransform).mTranslation.x != 0.0);
  auVar2._8_4_ = -(uint)((this->super_aiUVTransform).mScaling.x != 1.0);
  auVar2._12_4_ = -(uint)((this->super_aiUVTransform).mScaling.y != 1.0);
  iVar3 = movmskps(in_EAX,auVar2);
  paVar1 = &(this->super_aiUVTransform).mRotation;
  return (*paVar1 <= 0.008726646 && *paVar1 != 0.008726646) && iVar3 == 0;
}

Assistant:

inline bool IsUntransformed() const
    {
        return (1.0f == mScaling.x && 1.f == mScaling.y &&
            !mTranslation.x && !mTranslation.y &&
            mRotation < AI_TT_ROTATION_EPSILON);
    }